

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadBONE(B3DImporter *this,int id)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  int local_64;
  int i;
  Vertex *v;
  allocator<char> local_41;
  string local_40;
  float local_1c;
  int local_18;
  float weight;
  int vertex;
  int id_local;
  B3DImporter *this_local;
  
  weight = (float)id;
  _vertex = this;
  do {
    uVar2 = ChunkSize(this);
    if (uVar2 == 0) {
      return;
    }
    local_18 = ReadInt(this);
    local_1c = ReadFloat(this);
    iVar1 = local_18;
    if ((local_18 < 0) ||
       (sVar3 = std::
                vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::
                size(&this->_vertices), (int)sVar3 <= iVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Bad vertex index",&local_41);
      Fail(this,&local_40);
    }
    pvVar4 = std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
             ::operator[](&this->_vertices,(long)local_18);
    for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
      if ((pvVar4->weights[local_64] == 0.0) && (!NAN(pvVar4->weights[local_64]))) {
        pvVar4->bones[local_64] = SUB41(weight,0);
        pvVar4->weights[local_64] = local_1c;
        break;
      }
    }
  } while( true );
}

Assistant:

void B3DImporter::ReadBONE(int id) {
	while (ChunkSize()) {
		int vertex = ReadInt();
		float weight = ReadFloat();
		if (vertex < 0 || vertex >= (int)_vertices.size()) {
			Fail("Bad vertex index");
		}

		Vertex &v = _vertices[vertex];
		for (int i = 0; i < 4; ++i) {
			if (!v.weights[i]) {
				v.bones[i] = id;
				v.weights[i] = weight;
				break;
			}
		}
	}
}